

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_parameter_templates.cc
# Opt level: O0

void anon_unknown.dwarf_145f0b::Json2Type
               (Value *value,RdsDescribeParameterTemplatesResponseType *item)

{
  bool bVar1;
  Value *pVVar2;
  Json2Array<aliyun::RdsDescribeParameterTemplatesTemplateRecordType> local_79;
  string local_78;
  string local_58;
  string local_38;
  RdsDescribeParameterTemplatesResponseType *local_18;
  RdsDescribeParameterTemplatesResponseType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (RdsDescribeParameterTemplatesResponseType *)value;
  bVar1 = Json::Value::isMember(value,"Engine");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Engine");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->engine,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"EngineVersion");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"EngineVersion");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->engine_version,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"ParameterCount");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"ParameterCount");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->parameter_count,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Parameters");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Parameters");
    bVar1 = Json::Value::isMember(pVVar2,"TemplateRecord");
    if (bVar1) {
      pVVar2 = Json::Value::operator[]((Value *)item_local,"Parameters");
      pVVar2 = Json::Value::operator[](pVVar2,"TemplateRecord");
      Json2Array<aliyun::RdsDescribeParameterTemplatesTemplateRecordType>::Json2Array
                (&local_79,pVVar2,&local_18->parameters);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, RdsDescribeParameterTemplatesResponseType* item) {
  if(value.isMember("Engine")) {
    item->engine = value["Engine"].asString();
  }
  if(value.isMember("EngineVersion")) {
    item->engine_version = value["EngineVersion"].asString();
  }
  if(value.isMember("ParameterCount")) {
    item->parameter_count = value["ParameterCount"].asString();
  }
  if(value.isMember("Parameters") && value["Parameters"].isMember("TemplateRecord")) {
    Json2Array<RdsDescribeParameterTemplatesTemplateRecordType>(value["Parameters"]["TemplateRecord"], &item->parameters);
  }
}